

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cpp
# Opt level: O0

void cppcms::impl::setup_logging(value *settings)

{
  bool bVar1;
  byte bVar2;
  undefined4 uVar3;
  level_type lVar4;
  int iVar5;
  standard_error *this;
  char *pcVar6;
  ulong uVar7;
  syslog *this_00;
  shared_ptr *psVar8;
  file *this_01;
  element_type *peVar9;
  value *in_RDI;
  string tz;
  bool append;
  int max_files;
  shared_ptr<booster::log::sinks::file> file;
  string log_file;
  string *op;
  uint i;
  int ops;
  int facility_code;
  string sfacility;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vops;
  string facility;
  string id;
  level_type level;
  string *in_stack_fffffffffffffd58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  bool *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  syslog *in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  value *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdb9;
  undefined1 in_stack_fffffffffffffdba;
  undefined1 in_stack_fffffffffffffdbb;
  undefined1 in_stack_fffffffffffffdbc;
  undefined1 in_stack_fffffffffffffdbd;
  undefined1 in_stack_fffffffffffffdbe;
  undefined1 in_stack_fffffffffffffdbf;
  char *in_stack_fffffffffffffdc0;
  value *in_stack_fffffffffffffdc8;
  bool local_209;
  shared_ptr<booster::log::sinks::file> local_1f8;
  string local_1e8 [32];
  string local_1c8 [8];
  char *in_stack_fffffffffffffe40;
  value *in_stack_fffffffffffffe48;
  string local_188 [32];
  string local_168 [71];
  undefined1 local_121;
  reference local_100;
  uint local_f4;
  uint local_f0;
  int local_ec;
  string local_e8 [32];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  string local_98 [32];
  string local_78 [39];
  undefined1 local_51;
  undefined1 local_3d;
  string local_30 [36];
  undefined4 local_c;
  value *local_8;
  
  local_8 = in_RDI;
  json::value::get_abi_cxx11_
            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
             (char *)CONCAT17(in_stack_fffffffffffffdbf,
                              CONCAT16(in_stack_fffffffffffffdbe,
                                       CONCAT15(in_stack_fffffffffffffdbd,
                                                CONCAT14(in_stack_fffffffffffffdbc,
                                                         CONCAT13(in_stack_fffffffffffffdbb,
                                                                  CONCAT12(in_stack_fffffffffffffdba
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffdb9,
                                                  in_stack_fffffffffffffdb8))))))));
  uVar3 = booster::log::logger::string_to_level(local_30);
  std::__cxx11::string::~string(local_30);
  local_c = uVar3;
  lVar4 = booster::log::logger::instance();
  booster::log::logger::set_default_level(lVar4);
  json::value::find(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  bVar1 = json::value::is_undefined((value *)0x36234b);
  if (bVar1) {
    json::value::find(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    bVar1 = json::value::is_undefined((value *)0x36236d);
    if (bVar1) {
      json::value::find(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      bVar1 = json::value::is_undefined((value *)0x36238f);
      local_209 = true;
      if (bVar1) goto LAB_003623d5;
    }
  }
  local_3d = 0;
  local_209 = json::value::get<bool>
                        ((value *)in_stack_fffffffffffffd88,
                         (char *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                         in_stack_fffffffffffffd78);
LAB_003623d5:
  if (local_209 != false) {
    psVar8 = (shared_ptr *)booster::log::logger::instance();
    this = (standard_error *)operator_new(0x10);
    booster::log::sinks::standard_error::standard_error(this);
    std::shared_ptr<booster::log::sink>::shared_ptr<booster::log::sinks::standard_error,void>
              ((shared_ptr<booster::log::sink> *)in_stack_fffffffffffffd60,
               (standard_error *)in_stack_fffffffffffffd58);
    booster::log::logger::add_sink(psVar8);
    std::shared_ptr<booster::log::sink>::~shared_ptr((shared_ptr<booster::log::sink> *)0x362452);
  }
  local_51 = 0;
  bVar1 = json::value::get<bool>
                    ((value *)in_stack_fffffffffffffd88,
                     (char *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                     in_stack_fffffffffffffd78);
  if (bVar1) {
    json::value::get_abi_cxx11_
              (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
               (char *)CONCAT17(in_stack_fffffffffffffdbf,
                                CONCAT16(in_stack_fffffffffffffdbe,
                                         CONCAT15(in_stack_fffffffffffffdbd,
                                                  CONCAT14(in_stack_fffffffffffffdbc,
                                                           CONCAT13(in_stack_fffffffffffffdbb,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffdba,
                                                  CONCAT11(in_stack_fffffffffffffdb9,
                                                           in_stack_fffffffffffffdb8))))))));
    json::value::get_abi_cxx11_
              (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
               (char *)CONCAT17(in_stack_fffffffffffffdbf,
                                CONCAT16(in_stack_fffffffffffffdbe,
                                         CONCAT15(in_stack_fffffffffffffdbd,
                                                  CONCAT14(in_stack_fffffffffffffdbc,
                                                           CONCAT13(in_stack_fffffffffffffdbb,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffdba,
                                                  CONCAT11(in_stack_fffffffffffffdb9,
                                                           in_stack_fffffffffffffdb8))))))));
    local_c8 = 0;
    uStack_c0 = 0;
    local_b8 = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x362576);
    json::value::get<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffd88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    json::value::get_abi_cxx11_
              (local_8,in_stack_fffffffffffffdc0,
               (char *)CONCAT17(in_stack_fffffffffffffdbf,
                                CONCAT16(in_stack_fffffffffffffdbe,
                                         CONCAT15(in_stack_fffffffffffffdbd,
                                                  CONCAT14(in_stack_fffffffffffffdbc,
                                                           CONCAT13(in_stack_fffffffffffffdbb,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffdba,
                                                  CONCAT11(in_stack_fffffffffffffdb9,
                                                           in_stack_fffffffffffffdb8))))))));
    local_ec = 0;
    local_f0 = 0;
    local_f4 = 0;
    in_stack_fffffffffffffdc8 = local_8;
    while( true ) {
      in_stack_fffffffffffffdc0 = (char *)(ulong)local_f4;
      pcVar6 = (char *)std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size(&local_b0);
      if (pcVar6 <= in_stack_fffffffffffffdc0) break;
      local_100 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&local_b0,(ulong)local_f4);
      in_stack_fffffffffffffdbf =
           std::operator==(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      if ((bool)in_stack_fffffffffffffdbf) {
        local_f0 = local_f0 | 2;
      }
      else {
        in_stack_fffffffffffffdbe =
             std::operator==(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
        if ((bool)in_stack_fffffffffffffdbe) {
          local_f0 = local_f0 | 8;
        }
        else {
          in_stack_fffffffffffffdbd =
               std::operator==(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
          if ((bool)in_stack_fffffffffffffdbd) {
            local_f0 = local_f0 | 0x10;
          }
          else {
            in_stack_fffffffffffffdbc =
                 std::operator==(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
            if ((bool)in_stack_fffffffffffffdbc) {
              local_f0 = local_f0 | 4;
            }
            else {
              in_stack_fffffffffffffdbb =
                   std::operator==(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
              if ((bool)in_stack_fffffffffffffdbb) {
                local_f0 = local_f0 | 0x20;
              }
              else {
                in_stack_fffffffffffffdba =
                     std::operator==(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
                if ((bool)in_stack_fffffffffffffdba) {
                  local_f0 = local_f0 | 1;
                }
              }
            }
          }
        }
      }
      local_f4 = local_f4 + 1;
    }
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      in_stack_fffffffffffffdb9 =
           std::operator==(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
      if ((bool)in_stack_fffffffffffffdb9) {
        local_ec = 8;
      }
      else {
        in_stack_fffffffffffffdb8 =
             std::operator==(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
        if ((bool)in_stack_fffffffffffffdb8) {
          local_ec = 0x80;
        }
        else {
          bVar1 = std::operator==(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
          if (bVar1) {
            local_ec = 0x88;
          }
          else {
            bVar1 = std::operator==(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
            if (bVar1) {
              local_ec = 0x90;
            }
            else {
              bVar1 = std::operator==(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
              if (bVar1) {
                local_ec = 0x98;
              }
              else {
                bVar1 = std::operator==(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58)
                ;
                if (bVar1) {
                  local_ec = 0xa0;
                }
                else {
                  bVar1 = std::operator==(in_stack_fffffffffffffd60,
                                          (char *)in_stack_fffffffffffffd58);
                  if (bVar1) {
                    local_ec = 0xa8;
                  }
                  else {
                    bVar1 = std::operator==(in_stack_fffffffffffffd60,
                                            (char *)in_stack_fffffffffffffd58);
                    if (bVar1) {
                      local_ec = 0xb0;
                    }
                    else {
                      bVar1 = std::operator==(in_stack_fffffffffffffd60,
                                              (char *)in_stack_fffffffffffffd58);
                      if (!bVar1) {
                        local_121 = 1;
                        pcVar6 = (char *)__cxa_allocate_exception(0x30);
                        std::operator+(pcVar6,in_stack_fffffffffffffda0);
                        cppcms_error::cppcms_error
                                  ((cppcms_error *)in_stack_fffffffffffffd60,
                                   in_stack_fffffffffffffd58);
                        local_121 = 0;
                        __cxa_throw(pcVar6,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
                      }
                      local_ec = 0xb8;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      psVar8 = (shared_ptr *)booster::log::logger::instance();
      in_stack_fffffffffffffd88 = (syslog *)operator_new(0x10);
      booster::log::sinks::syslog::syslog(in_stack_fffffffffffffd88,local_78,local_f0,local_ec);
      std::shared_ptr<booster::log::sink>::shared_ptr<booster::log::sinks::syslog,void>
                ((shared_ptr<booster::log::sink> *)in_stack_fffffffffffffd60,
                 (syslog *)in_stack_fffffffffffffd58);
      booster::log::logger::add_sink(psVar8);
      std::shared_ptr<booster::log::sink>::~shared_ptr((shared_ptr<booster::log::sink> *)0x362c17);
    }
    else {
      psVar8 = (shared_ptr *)booster::log::logger::instance();
      this_00 = (syslog *)operator_new(0x10);
      booster::log::sinks::syslog::syslog(this_00,local_f0,local_ec);
      std::shared_ptr<booster::log::sink>::shared_ptr<booster::log::sinks::syslog,void>
                ((shared_ptr<booster::log::sink> *)in_stack_fffffffffffffd60,
                 (syslog *)in_stack_fffffffffffffd58);
      booster::log::logger::add_sink(psVar8);
      std::shared_ptr<booster::log::sink>::~shared_ptr((shared_ptr<booster::log::sink> *)0x362b55);
    }
    std::__cxx11::string::~string(local_e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_78);
  }
  std::__cxx11::string::string(local_168);
  json::value::get_abi_cxx11_
            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
             (char *)CONCAT17(in_stack_fffffffffffffdbf,
                              CONCAT16(in_stack_fffffffffffffdbe,
                                       CONCAT15(in_stack_fffffffffffffdbd,
                                                CONCAT14(in_stack_fffffffffffffdbc,
                                                         CONCAT13(in_stack_fffffffffffffdbb,
                                                                  CONCAT12(in_stack_fffffffffffffdba
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffdb9,
                                                  in_stack_fffffffffffffdb8))))))));
  std::__cxx11::string::operator=(local_168,local_188);
  bVar2 = std::__cxx11::string::empty();
  bVar2 = bVar2 ^ 0xff;
  std::__cxx11::string::~string(local_188);
  if ((bVar2 & 1) != 0) {
    this_01 = (file *)operator_new(0x30);
    booster::log::sinks::file::file(this_01);
    std::shared_ptr<booster::log::sinks::file>::shared_ptr<booster::log::sinks::file,void>
              ((shared_ptr<booster::log::sinks::file> *)in_stack_fffffffffffffd60,
               (file *)in_stack_fffffffffffffd58);
    iVar5 = json::value::get<int>
                      ((value *)in_stack_fffffffffffffd88,
                       (char *)CONCAT17(bVar2,in_stack_fffffffffffffd80),(int *)this_01);
    if (0 < iVar5) {
      peVar9 = std::
               __shared_ptr_access<booster::log::sinks::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<booster::log::sinks::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x362dc0);
      booster::log::sinks::file::max_files((uint)peVar9);
    }
    bVar1 = json::value::get<bool>
                      ((value *)in_stack_fffffffffffffd88,
                       (char *)CONCAT17(bVar2,in_stack_fffffffffffffd80),(bool *)this_01);
    if (bVar1) {
      std::__shared_ptr_access<booster::log::sinks::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<booster::log::sinks::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x362e81);
      booster::log::sinks::file::append();
    }
    peVar9 = std::
             __shared_ptr_access<booster::log::sinks::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<booster::log::sinks::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x362e9a);
    std::__cxx11::string::string(local_1c8,local_168);
    booster::log::sinks::file::open(peVar9,local_1c8);
    std::__cxx11::string::~string(local_1c8);
    json::value::get_abi_cxx11_
              (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
               (char *)CONCAT17(in_stack_fffffffffffffdbf,
                                CONCAT16(in_stack_fffffffffffffdbe,
                                         CONCAT15(in_stack_fffffffffffffdbd,
                                                  CONCAT14(in_stack_fffffffffffffdbc,
                                                           CONCAT13(in_stack_fffffffffffffdbb,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffdba,
                                                  CONCAT11(in_stack_fffffffffffffdb9,
                                                           in_stack_fffffffffffffdb8))))))));
    peVar9 = std::
             __shared_ptr_access<booster::log::sinks::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<booster::log::sinks::file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x362f09);
    booster::log::sinks::file::set_timezone((string *)peVar9);
    psVar8 = (shared_ptr *)booster::log::logger::instance();
    std::shared_ptr<booster::log::sink>::shared_ptr<booster::log::sinks::file,void>
              ((shared_ptr<booster::log::sink> *)psVar8,&local_1f8);
    booster::log::logger::add_sink(psVar8);
    std::shared_ptr<booster::log::sink>::~shared_ptr((shared_ptr<booster::log::sink> *)0x362f5d);
    std::__cxx11::string::~string(local_1e8);
    std::shared_ptr<booster::log::sinks::file>::~shared_ptr
              ((shared_ptr<booster::log::sinks::file> *)0x362f77);
  }
  std::__cxx11::string::~string(local_168);
  return;
}

Assistant:

void impl::setup_logging(json::value const &settings)
{
	using namespace booster::log;
	level_type level = logger::string_to_level(settings.get("logging.level","error"));
	logger::instance().set_default_level(level);
	if(	(
			settings.find("logging.file").is_undefined()
			&& settings.find("logging.syslog").is_undefined()
			&& settings.find("logging.stderr").is_undefined()
		)
		|| 
		settings.get("logging.stderr",false)==true
	  )
	{
		logger::instance().add_sink(booster::shared_ptr<sink>(new sinks::standard_error()));
	}
	if(settings.get("logging.syslog.enable",false)==true) {
		#ifndef CPPCMS_POSIX
			throw cppcms_error("Syslog is not availible on Windows");
		#else
		std::string id = settings.get("logging.syslog.id","");
		std::string facility = settings.get("logging.syslog.facility","user");
		std::vector<std::string> vops = settings.get("logging.syslog.options",std::vector<std::string>());
		std::string sfacility = settings.get("logging.syslog.options","");
		int facility_code = 0;
		int ops = 0;
		for(unsigned i=0;i<vops.size();i++) {
			std::string const &op=vops[i];
			if(op=="LOG_CONS") ops|=LOG_CONS;
			else if(op=="LOG_NDELAY") ops|=LOG_NDELAY;
			else if(op=="LOG_NOWAIT") ops|=LOG_NOWAIT;
			else if(op=="LOG_ODELAY") ops|=LOG_ODELAY;
			#ifdef LOG_PERROR
			else if(op=="LOG_PERROR") ops|=LOG_PERROR;
			#endif
			else if(op=="LOG_PID") ops|=LOG_PID;
		}
		if(!facility.empty()) {
			if(facility == "user") {
				facility_code = LOG_USER;
			} else if(facility == "local0") {
				facility_code = LOG_LOCAL0;
			} else if(facility == "local1") {
				facility_code = LOG_LOCAL1;
			} else if(facility == "local2") {
				facility_code = LOG_LOCAL2;
			} else if(facility == "local3") {
				facility_code = LOG_LOCAL3;
			} else if(facility == "local4") {
				facility_code = LOG_LOCAL4;
			} else if(facility == "local5") {
				facility_code = LOG_LOCAL5;
			} else if(facility == "local6") {
				facility_code = LOG_LOCAL6;
			} else if(facility == "local7") {
				facility_code = LOG_LOCAL7;
			} else {
				throw cppcms_error("Unsupported syslog facility: " + facility);
			}
		}
		if(id.empty())
			logger::instance().add_sink(booster::shared_ptr<sink>(new sinks::syslog(ops,facility_code)));
		else
			logger::instance().add_sink(booster::shared_ptr<sink>(new sinks::syslog(id,ops,facility_code)));
		#endif
	}

	std::string log_file;
	if(!(log_file=settings.get("logging.file.name","")).empty()) {
		booster::shared_ptr<sinks::file> file(new sinks::file());
		int max_files=0;
		if((max_files = settings.get("logging.file.max_files",0)) > 0)
			file->max_files(max_files);
		bool append = false;
		if((append = settings.get("logging.file.append",false))==true)
			file->append();
		file->open(log_file);
		std::string tz = settings.get("logging.file.timezone","");
		file->set_timezone(tz);
		logger::instance().add_sink(file);
	}
}